

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex_float.h
# Opt level: O1

ostream * spvtools::utils::operator<<
                    (ostream *os,
                    HexFloat<spvtools::utils::FloatProxy<double>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<double>_>_>
                    *value)

{
  ostream *poVar1;
  ulong uVar2;
  ulong uVar3;
  ostream oVar4;
  ulong uVar5;
  ulong uVar6;
  char *pcVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  bool bVar11;
  byte local_49;
  char *local_48;
  undefined4 local_3c;
  ulong local_38;
  
  uVar2 = (value->value_).data_;
  pcVar7 = "-";
  if (-1 < (long)uVar2) {
    pcVar7 = "";
  }
  uVar8 = (ulong)((uint)(uVar2 >> 0x34) & 0x7ff);
  uVar5 = uVar2 & 0xfffffffffffff;
  local_38 = 0;
  if (uVar8 != 0 || uVar5 != 0) {
    local_38 = uVar8 - 0x3ff;
  }
  uVar6 = uVar5;
  if ((uVar8 != 0 || uVar5 != 0) && uVar8 == 0) {
    if ((uVar2 & 0x8000000000000) == 0) {
      uVar3 = 0x3f;
      if ((uVar2 & 0x7ffffffffffff) != 0) {
        for (; (uVar2 & 0x7ffffffffffff) >> uVar3 == 0; uVar3 = uVar3 - 1) {
        }
      }
      uVar6 = uVar5 << (~(byte)uVar3 + 0x34 & 0x3f);
      local_38 = (local_38 | 0xc) - (uVar3 ^ 0x3f);
    }
    uVar6 = uVar6 * 2 & 0xffffffffffffe;
  }
  uVar3 = uVar6 & 0xf;
  lVar10 = 0xd;
  while (uVar3 == 0) {
    lVar9 = lVar10 + -1;
    bVar11 = lVar10 == 1;
    lVar10 = lVar9;
    if (bVar11) break;
    uVar3 = uVar6 & 0xf0;
    uVar6 = uVar6 >> 4;
  }
  lVar9 = *(long *)(*(long *)os + -0x18);
  poVar1 = os + lVar9;
  local_3c = *(undefined4 *)(os + lVar9 + 0x18);
  if (os[lVar9 + 0xe1] == (ostream)0x0) {
    local_48 = pcVar7;
    oVar4 = (ostream)std::ios::widen((char)poVar1);
    poVar1[0xe0] = oVar4;
    poVar1[0xe1] = (ostream)0x1;
    pcVar7 = local_48;
  }
  local_48 = (char *)CONCAT71(local_48._1_7_,poVar1[0xe0]);
  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar7,uVar2 >> 0x3f);
  std::__ostream_insert<char,std::char_traits<char>>(os,"0x",2);
  local_49 = (uVar8 != 0 || uVar5 != 0) | 0x30;
  std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_49,1);
  if (lVar10 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(os,".",1);
    lVar9 = *(long *)os;
    *(long *)(os + *(long *)(lVar9 + -0x18) + 0x10) = (long)(int)lVar10;
    lVar10 = *(long *)(lVar9 + -0x18);
    poVar1 = os + lVar10;
    if (os[lVar10 + 0xe1] == (ostream)0x0) {
      oVar4 = (ostream)std::ios::widen((char)poVar1);
      poVar1[0xe0] = oVar4;
      poVar1[0xe1] = (ostream)0x1;
    }
    poVar1[0xe0] = (ostream)0x30;
    *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) =
         *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) & 0xffffffb5 | 8;
    std::ostream::_M_insert<unsigned_long>((ulong)os);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"p",1);
  *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) =
       *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) & 0xffffffb5 | 2;
  pcVar7 = "";
  if (-1 < (long)local_38) {
    pcVar7 = "+";
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar7,(ulong)(-1 < (long)local_38));
  std::ostream::_M_insert<long>((long)os);
  lVar10 = *(long *)os;
  *(undefined4 *)(os + *(long *)(lVar10 + -0x18) + 0x18) = local_3c;
  lVar10 = *(long *)(lVar10 + -0x18);
  poVar1 = os + lVar10;
  if (os[lVar10 + 0xe1] == (ostream)0x0) {
    oVar4 = (ostream)std::ios::widen((char)poVar1);
    poVar1[0xe0] = oVar4;
    poVar1[0xe1] = (ostream)0x1;
  }
  poVar1[0xe0] = local_48._0_1_;
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const HexFloat<T, Traits>& value) {
  using HF = HexFloat<T, Traits>;
  using uint_type = typename HF::uint_type;
  using int_type = typename HF::int_type;

  static_assert(HF::num_used_bits != 0,
                "num_used_bits must be non-zero for a valid float");
  static_assert(HF::num_exponent_bits != 0,
                "num_exponent_bits must be non-zero for a valid float");
  static_assert(HF::num_fraction_bits != 0,
                "num_fractin_bits must be non-zero for a valid float");

  const uint_type bits = value.value().data();
  const char* const sign = (bits & HF::sign_mask) ? "-" : "";
  const uint_type exponent = static_cast<uint_type>(
      (bits & HF::exponent_mask) >> HF::num_fraction_bits);

  uint_type fraction = static_cast<uint_type>((bits & HF::fraction_encode_mask)
                                              << HF::num_overflow_bits);

  const bool is_zero = exponent == 0 && fraction == 0;
  const bool is_denorm = exponent == 0 && !is_zero;

  // exponent contains the biased exponent we have to convert it back into
  // the normal range.
  int_type int_exponent = static_cast<int_type>(exponent - HF::exponent_bias);
  // If the number is all zeros, then we actually have to NOT shift the
  // exponent.
  int_exponent = is_zero ? 0 : int_exponent;

  // If we are denorm, then start shifting, and decreasing the exponent until
  // our leading bit is 1.

  if (is_denorm) {
    while ((fraction & HF::fraction_top_bit) == 0) {
      fraction = static_cast<uint_type>(fraction << 1);
      int_exponent = static_cast<int_type>(int_exponent - 1);
    }
    // Since this is denormalized, we have to consume the leading 1 since it
    // will end up being implicit.
    fraction = static_cast<uint_type>(fraction << 1);  // eat the leading 1
    fraction &= HF::fraction_represent_mask;
  }

  uint_type fraction_nibbles = HF::fraction_nibbles;
  // We do not have to display any trailing 0s, since this represents the
  // fractional part.
  while (fraction_nibbles > 0 && (fraction & 0xF) == 0) {
    // Shift off any trailing values;
    fraction = static_cast<uint_type>(fraction >> 4);
    --fraction_nibbles;
  }

  const auto saved_flags = os.flags();
  const auto saved_fill = os.fill();

  os << sign << "0x" << (is_zero ? '0' : '1');
  if (fraction_nibbles) {
    // Make sure to keep the leading 0s in place, since this is the fractional
    // part.
    os << "." << std::setw(static_cast<int>(fraction_nibbles))
       << std::setfill('0') << std::hex << fraction;
  }
  os << "p" << std::dec << (int_exponent >= 0 ? "+" : "") << int_exponent;

  os.flags(saved_flags);
  os.fill(saved_fill);

  return os;
}